

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# final_contours_extract_features.cpp
# Opt level: O1

int main(int param_1,char **argv)

{
  string *psVar1;
  uchar **ppuVar2;
  int in_R8D;
  allocator<char> local_b9;
  _InputArray local_b8;
  undefined1 local_98 [16];
  uchar *local_88 [10];
  undefined8 local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,argv[1],&local_b9);
  cv::imread((string *)local_98,(int)&local_b8);
  cv::Mat::operator=(&src,(Mat *)local_98);
  cv::Mat::~Mat((Mat *)local_98);
  if ((Size *)local_b8._0_8_ != &local_b8.sz) {
    operator_delete((void *)local_b8._0_8_,(long)local_b8.sz + 1);
  }
  local_88[0] = (uchar *)0x0;
  local_98._0_4_ = 0x1010000;
  local_98._8_8_ = &src;
  local_b8.sz.width = 0;
  local_b8.sz.height = 0;
  local_b8.flags = 0x2010000;
  local_b8.obj = &src_gray;
  cv::cvtColor((cv *)local_98,&local_b8,(_OutputArray *)0x6,0,in_R8D);
  local_88[0] = (uchar *)0x0;
  local_98._0_4_ = 0x1010000;
  local_98._8_8_ = &src_gray;
  local_b8.sz.width = 0;
  local_b8.sz.height = 0;
  local_b8.flags = 0x2010000;
  local_b8.obj = &src_gray;
  local_38 = 0x500000005;
  cv::GaussianBlur(0,0,local_98,&local_b8,&local_38,4);
  local_98._0_8_ = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Source","");
  cv::namedWindow((string *)local_98,1);
  if ((uchar **)local_98._0_8_ != local_88) {
    operator_delete((void *)local_98._0_8_,(ulong)(local_88[0] + 1));
  }
  local_98._0_8_ = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98," Threshold:","");
  local_b8._0_8_ = &local_b8.sz;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Source","");
  psVar1 = (string *)&local_b8;
  cv::createTrackbar((string *)local_98,psVar1,&thresh,max_thresh,thresh_callback,(void *)0x0);
  if ((Size *)local_b8._0_8_ != &local_b8.sz) {
    psVar1 = (string *)((long)local_b8.sz + 1);
    operator_delete((void *)local_b8._0_8_,(ulong)psVar1);
  }
  ppuVar2 = (uchar **)local_98._0_8_;
  if ((uchar **)local_98._0_8_ != local_88) {
    psVar1 = (string *)(local_88[0] + 1);
    operator_delete((void *)local_98._0_8_,(ulong)psVar1);
  }
  thresh_callback((int)ppuVar2,psVar1);
  cv::waitKey(0);
  return 0;
}

Assistant:

int main( int, char** argv )
{
  /// Load source image and convert it to gray
  src = imread( argv[1], 1 );
  
//  pyrMeanShiftFiltering( src, dst, 10, 35, 3);
//  imshow("mean-segment", dst);
  /// Convert image to gray and blur it
  cvtColor( src, src_gray, COLOR_BGR2GRAY );
  GaussianBlur( src_gray, src_gray, Size(5,5),0,0 );
   //imshow("src_gray_blur", src_gray);
//	equalizeHist(src_gray, src_gray);
//	imshow("src_gray_eq", src_gray);
  /// Create Window
  const char* source_window = "Source";
  namedWindow( source_window, WINDOW_AUTOSIZE );
  //imshow( source_window, src );
//add for user threshold i/p
 createTrackbar( " Threshold:", "Source", &thresh, max_thresh, thresh_callback );
  thresh_callback( 0, 0 );

  waitKey(0);
  return(0);
}